

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SyntaxKind kind;
  ExpressionSyntax *syntax_00;
  bitmask<slang::ast::AssignFlags> flags;
  BinaryOperator BVar2;
  bool bVar1;
  int iVar3;
  Expression *pEVar4;
  ulong uVar5;
  undefined4 extraout_var;
  Scope *lhs_00;
  ulong uVar6;
  bitmask<slang::ast::ASTFlags> extraFlags;
  uint uVar7;
  DiagCode code;
  SyntaxNode *syntax_01;
  SourceRange SVar8;
  SourceRange SVar9;
  Expression *lhs;
  TimingControl *local_c8;
  SourceLocation local_a8;
  SourceLocation SStack_a0;
  SourceLocation local_98;
  SourceLocation SStack_90;
  SourceLocation local_88;
  SourceLocation SStack_80;
  SourceLocation local_78;
  SourceLocation SStack_70;
  Scope *local_68;
  char acStack_60 [8];
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  kind = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  uVar6 = (context->flags).m_bits;
  uVar7 = (uint)uVar6;
  if (kind == NonblockingAssignmentExpression) {
    flags.m_bits = '\x01';
    if ((uVar7 >> 0xc & 1) != 0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      code.subsystem = Expressions;
      code.code = 0xcb;
      goto LAB_0041b3d2;
    }
  }
  else {
    flags.m_bits = '\0';
  }
  if ((uVar6 & 8) != 0) {
    extraFlags.m_bits = 0x80;
    uVar6 = 0;
    if (kind == AssignmentExpression) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      if (kind != NonblockingAssignmentExpression) {
        BVar2 = OpInfo::getBinary(kind);
        uVar6 = (ulong)BVar2;
        uVar7 = (uint)(context->flags).m_bits;
        uVar5 = 0x100000000;
        extraFlags.m_bits = 0;
      }
    }
    syntax_01 = &((syntax->right).ptr)->super_SyntaxNode;
    if (((uVar7 >> 8 & 1) == 0) ||
       (((SyntaxNode *)&syntax_01->kind)->kind != TimingControlExpression)) {
      local_c8 = (TimingControl *)0x0;
    }
    else {
      local_68 = (context->scope).ptr;
      acStack_60 = *(char (*) [8])&context->lookupIndex;
      pSStack_50 = context->instanceOrProc;
      local_48 = context->firstTempVar;
      pRStack_40 = context->randomizeDetails;
      local_38 = context->assertionInstance;
      local_58 = (ulong)(kind == NonblockingAssignmentExpression) << 0xd | (context->flags).m_bits |
                 0x100000;
      iVar3 = TimingControl::bind((int)*(undefined8 *)
                                        &((ExpressionSyntax *)(syntax_01 + 1))->super_SyntaxNode,
                                  (sockaddr *)&local_68,(socklen_t)extraFlags.m_bits);
      local_c8 = (TimingControl *)CONCAT44(extraout_var,iVar3);
      syntax_01 = (((ExpressionSyntax *)(syntax_01 + 1))->super_SyntaxNode).parent;
    }
    syntax_00 = (syntax->left).ptr;
    if ((((syntax_00->super_SyntaxNode).kind == AssignmentPatternExpression) &&
        (syntax_01->kind != StreamingConcatenationExpression)) &&
       (*(long *)&syntax_00[1].super_SyntaxNode == 0)) {
      pEVar4 = Expression::selfDetermined
                         (compilation,(ExpressionSyntax *)syntax_01,context,
                          (bitmask<slang::ast::ASTFlags>)0x0);
      local_68 = (Scope *)Expression::create(compilation,(syntax->left).ptr,context,
                                             (bitmask<slang::ast::ASTFlags>)0x100000,
                                             (pEVar4->type).ptr);
      Expression::selfDetermined(context,(Expression **)&local_68);
      lhs_00 = local_68;
      SVar8 = parsing::Token::range(&syntax->operatorToken);
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_88 = SVar9.startLoc;
      SStack_80 = SVar9.endLoc;
      local_78 = SVar8.startLoc;
      SStack_70 = SVar8.endLoc;
      local_98 = local_78;
      SStack_90 = SStack_70;
      local_a8 = local_88;
      SStack_a0 = SStack_80;
    }
    else {
      lhs_00 = (Scope *)Expression::selfDetermined
                                  (compilation,syntax_00,context,
                                   (bitmask<slang::ast::ASTFlags>)(extraFlags.m_bits + 0x100000));
      bVar1 = Type::isVirtualInterfaceOrArray
                        (((not_null<const_slang::ast::Type_*> *)&lhs_00->thisSym)->ptr);
      if ((!bVar1) ||
         (pEVar4 = Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)syntax_01,false),
         pEVar4 == (Expression *)0x0)) {
        if ((*(ExpressionKind *)&lhs_00->compilation == Streaming) &&
           (syntax_01->kind != StreamingConcatenationExpression)) {
          pEVar4 = Expression::selfDetermined
                             (compilation,(ExpressionSyntax *)syntax_01,context,extraFlags);
        }
        else {
          pEVar4 = Expression::create(compilation,(ExpressionSyntax *)syntax_01,context,extraFlags,
                                      ((not_null<const_slang::ast::Type_*> *)&lhs_00->thisSym)->ptr)
          ;
        }
      }
      SVar8 = parsing::Token::range(&syntax->operatorToken);
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      local_a8 = SVar9.startLoc;
      SStack_a0 = SVar9.endLoc;
      local_98 = SVar8.startLoc;
      SStack_90 = SVar8.endLoc;
    }
    SVar8.endLoc = SStack_90;
    SVar8.startLoc = local_98;
    SVar9.endLoc = SStack_a0;
    SVar9.startLoc = local_a8;
    pEVar4 = fromComponents(compilation,(optional<slang::ast::BinaryOperator>)(uVar5 | uVar6),flags,
                            (Expression *)lhs_00,pEVar4,SVar8,local_c8,SVar9,context);
    return pEVar4;
  }
  SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  code.subsystem = Expressions;
  code.code = 0xb;
  if ((uVar6 & 0x30) == 0) {
    code.subsystem = Expressions;
    code.code = 0x17;
  }
LAB_0041b3d2:
  ASTContext::addDiag(context,code,SVar8);
  pEVar4 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar4;
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = OpInfo::getBinary(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            auto rhs = &selfDetermined(compilation, *rightExpr, context);
            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.range(), timingControl, syntax.sourceRange(),
                                  context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterfaceOrArray())
        rhs = tryBindInterfaceRef(context, *rightExpr, /* isInterfacePort */ false);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.range(),
                          timingControl, syntax.sourceRange(), context);
}